

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_12a29d3::SDLJoystick::~SDLJoystick(SDLJoystick *this)

{
  SDL_JoystickClose(this->joystick_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->hat_values_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  return;
}

Assistant:

~SDLJoystick() {
			SDL_JoystickClose(joystick_);
		}